

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O0

LY_ERR parse_inout(lysp_yang_ctx *ctx,ly_stmt inout_kw,lysp_node *parent,
                  lysp_node_action_inout *inout_p)

{
  uint16_t uVar1;
  LY_ERR LVar2;
  char *pcVar3;
  char *pcVar4;
  bool bVar5;
  ly_ctx *local_e0;
  ly_ctx *local_d0;
  ly_ctx *local_c0;
  ly_ctx *local_a8;
  ly_ctx *local_a0;
  ly_ctx *local_90;
  LY_ERR ret___11;
  LY_ERR ret___10;
  LY_ERR ret___9;
  LY_ERR ret___8;
  LY_ERR ret___7;
  LY_ERR ret___6;
  LY_ERR ret___5;
  LY_ERR ret___4;
  LY_ERR ret___3;
  LY_ERR ret___2;
  LY_ERR ret___1;
  ly_bool __loop_end;
  LY_ERR ret__;
  ly_bool input;
  size_t sStack_48;
  ly_stmt kw;
  size_t word_len;
  char *word;
  lysp_node_action_inout *plStack_30;
  LY_ERR ret;
  lysp_node_action_inout *inout_p_local;
  lysp_node *parent_local;
  lysp_yang_ctx *plStack_18;
  ly_stmt inout_kw_local;
  lysp_yang_ctx *ctx_local;
  
  word._4_4_ = 0;
  bVar5 = (lysp_node_action_inout *)&parent[1].next == inout_p;
  plStack_30 = inout_p;
  inout_p_local = (lysp_node_action_inout *)parent;
  parent_local._4_4_ = inout_kw;
  plStack_18 = ctx;
  if ((inout_p->field_0).node.nodetype != 0) {
    if (ctx == (lysp_yang_ctx *)0x0) {
      local_90 = (ly_ctx *)0x0;
    }
    else {
      local_90 = (ly_ctx *)
                 **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
    }
    pcVar3 = lyplg_ext_stmt2str(inout_kw);
    ly_vlog(local_90,(char *)0x0,LYVE_SYNTAX_YANG,"Duplicate keyword \"%s\".",pcVar3);
    return LY_EVALID;
  }
  if (ctx == (lysp_yang_ctx *)0x0) {
    local_a0 = (ly_ctx *)0x0;
  }
  else {
    local_a0 = (ly_ctx *)
               **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
  }
  pcVar3 = "output";
  if (bVar5) {
    pcVar3 = "input";
  }
  LVar2 = lydict_insert(local_a0,pcVar3,0,&(inout_p->field_0).node.name);
  if (LVar2 != LY_SUCCESS) {
    return LVar2;
  }
  uVar1 = 0x2000;
  if (bVar5) {
    uVar1 = 0x1000;
  }
  (plStack_30->field_0).node.nodetype = uVar1;
  (plStack_30->field_0).node.parent = (lysp_node *)inout_p_local;
  word._4_4_ = get_keyword(plStack_18,&ret__,(char **)&word_len,&stack0xffffffffffffffb8);
  if (word._4_4_ != LY_SUCCESS) {
    return word._4_4_;
  }
  if (ret__ == 0x350001) {
    ret___2._3_1_ = 1;
    LVar2 = LY_SUCCESS;
  }
  else {
    if (ret__ != 0x350002) {
      if (plStack_18 == (lysp_yang_ctx *)0x0) {
        local_a8 = (ly_ctx *)0x0;
      }
      else {
        local_a8 = (ly_ctx *)
                   **(undefined8 **)
                     (plStack_18->parsed_mods->field_2).dnodes[plStack_18->parsed_mods->count - 1];
      }
      pcVar3 = lyplg_ext_stmt2str(ret__);
      ly_vlog(local_a8,(char *)0x0,LYVE_SYNTAX_YANG,
              "Invalid keyword \"%s\", expected \";\" or \"{\".",pcVar3);
      return LY_EVALID;
    }
    LVar2 = get_keyword(plStack_18,&ret__,(char **)&word_len,&stack0xffffffffffffffb8);
    if (LVar2 != LY_SUCCESS) {
      return LVar2;
    }
    ret___2._3_1_ = ret__ == 0x350003;
    LVar2 = LY_SUCCESS;
  }
  do {
    word._4_4_ = LVar2;
    if ((bool)ret___2._3_1_) {
      return word._4_4_;
    }
    if (ret__ == 0x20) {
      if (*(byte *)&(plStack_18->parsed_mods->field_2).dnodes[plStack_18->parsed_mods->count - 1][2]
                    .schema < 2) {
        if (plStack_18 == (lysp_yang_ctx *)0x0) {
          local_c0 = (ly_ctx *)0x0;
        }
        else {
          local_c0 = (ly_ctx *)
                     **(undefined8 **)
                       (plStack_18->parsed_mods->field_2).dnodes[plStack_18->parsed_mods->count - 1]
          ;
        }
        pcVar3 = lyplg_ext_stmt2str(parent_local._4_4_);
        ly_vlog(local_c0,(char *)0x0,LYVE_SYNTAX_YANG,
                "Invalid keyword \"%s\" as a child of \"%s\" - the statement is allowed only in YANG 1.1 modules."
                ,"anydata",pcVar3);
        return LY_EVALID;
      }
LAB_001c2ca0:
      LVar2 = parse_any(plStack_18,ret__,(lysp_node *)plStack_30,&plStack_30->child);
    }
    else {
      if (ret__ == 0x40) goto LAB_001c2ca0;
      if (ret__ == 0x200) {
        LVar2 = parse_choice(plStack_18,(lysp_node *)plStack_30,&plStack_30->child);
      }
      else if (ret__ == 0x400) {
        LVar2 = parse_container(plStack_18,(lysp_node *)plStack_30,&plStack_30->child);
      }
      else if (ret__ == 0x800) {
        LVar2 = parse_grouping(plStack_18,(lysp_node *)plStack_30,&plStack_30->groupings);
      }
      else if (ret__ == 0x1000) {
        LVar2 = parse_leaf(plStack_18,(lysp_node *)plStack_30,&plStack_30->child);
      }
      else if (ret__ == 0x2000) {
        LVar2 = parse_leaflist(plStack_18,(lysp_node *)plStack_30,&plStack_30->child);
      }
      else if (ret__ == 0x4000) {
        LVar2 = parse_list(plStack_18,(lysp_node *)plStack_30,&plStack_30->child);
      }
      else if (ret__ == 0x8000) {
        LVar2 = parse_uses(plStack_18,(lysp_node *)plStack_30,&plStack_30->child);
      }
      else if (ret__ == 0xf0000) {
        LVar2 = parse_ext(plStack_18,(char *)word_len,sStack_48,plStack_30,parent_local._4_4_,0,
                          &(plStack_30->field_0).node.exts);
      }
      else if (ret__ == 0x1d0000) {
        if (*(byte *)&(plStack_18->parsed_mods->field_2).dnodes[plStack_18->parsed_mods->count - 1]
                      [2].schema < 2) {
          if (plStack_18 == (lysp_yang_ctx *)0x0) {
            local_d0 = (ly_ctx *)0x0;
          }
          else {
            local_d0 = (ly_ctx *)
                       **(undefined8 **)
                         (plStack_18->parsed_mods->field_2).dnodes
                         [plStack_18->parsed_mods->count - 1];
          }
          pcVar3 = lyplg_ext_stmt2str(parent_local._4_4_);
          ly_vlog(local_d0,(char *)0x0,LYVE_SYNTAX_YANG,
                  "Invalid keyword \"%s\" as a child of \"%s\" - the statement is allowed only in YANG 1.1 modules."
                  ,"must",pcVar3);
          return LY_EVALID;
        }
        LVar2 = parse_restrs(plStack_18,LY_STMT_MUST,&plStack_30->musts);
      }
      else {
        if (ret__ != 0x2f0000) {
          if (plStack_18 == (lysp_yang_ctx *)0x0) {
            local_e0 = (ly_ctx *)0x0;
          }
          else {
            local_e0 = (ly_ctx *)
                       **(undefined8 **)
                         (plStack_18->parsed_mods->field_2).dnodes
                         [plStack_18->parsed_mods->count - 1];
          }
          pcVar3 = lyplg_ext_stmt2str(ret__);
          pcVar4 = lyplg_ext_stmt2str(parent_local._4_4_);
          ly_vlog(local_e0,(char *)0x0,LYVE_SYNTAX_YANG,
                  "Invalid keyword \"%s\" as a child of \"%s\".",pcVar3,pcVar4);
          return LY_EVALID;
        }
        LVar2 = parse_typedef(plStack_18,(lysp_node *)plStack_30,&plStack_30->typedefs);
      }
    }
    if (LVar2 != LY_SUCCESS) {
      return LVar2;
    }
    word._4_4_ = get_keyword(plStack_18,&ret__,(char **)&word_len,&stack0xffffffffffffffb8);
    if (word._4_4_ != LY_SUCCESS) {
      return word._4_4_;
    }
    LVar2 = LY_SUCCESS;
    if (ret__ == 0x350003) {
      if (((plStack_30->field_0).node.exts != (lysp_ext_instance *)0x0) &&
         (LVar2 = ly_set_add(&plStack_18->main_ctx->ext_inst,(plStack_30->field_0).node.exts,'\x01',
                             (uint32_t *)0x0), LVar2 != LY_SUCCESS)) {
        return LVar2;
      }
      word._4_4_ = LVar2;
      ret___2._3_1_ = true;
      LVar2 = word._4_4_;
    }
  } while( true );
}

Assistant:

static LY_ERR
parse_inout(struct lysp_yang_ctx *ctx, enum ly_stmt inout_kw, struct lysp_node *parent,
        struct lysp_node_action_inout *inout_p)
{
    LY_ERR ret = LY_SUCCESS;
    char *word;
    size_t word_len;
    enum ly_stmt kw;
    ly_bool input = &((struct lysp_node_action *)parent)->input == inout_p ? 1 : 0;

    if (inout_p->nodetype) {
        LOGVAL_PARSER(ctx, LY_VCODE_DUPSTMT, lyplg_ext_stmt2str(inout_kw));
        return LY_EVALID;
    }

    /* initiate structure */
    LY_CHECK_RET(lydict_insert(PARSER_CTX(ctx), input ? "input" : "output", 0, &inout_p->name));
    inout_p->nodetype = input ? LYS_INPUT : LYS_OUTPUT;
    inout_p->parent = parent;

    /* parse substatements */
    YANG_READ_SUBSTMT_FOR_GOTO(ctx, kw, word, word_len, ret, cleanup) {
        switch (kw) {
        case LY_STMT_ANYDATA:
            PARSER_CHECK_STMTVER2_RET(ctx, "anydata", lyplg_ext_stmt2str(inout_kw));
        /* fall through */
        case LY_STMT_ANYXML:
            LY_CHECK_RET(parse_any(ctx, kw, (struct lysp_node *)inout_p, &inout_p->child));
            break;
        case LY_STMT_CHOICE:
            LY_CHECK_RET(parse_choice(ctx, (struct lysp_node *)inout_p, &inout_p->child));
            break;
        case LY_STMT_CONTAINER:
            LY_CHECK_RET(parse_container(ctx, (struct lysp_node *)inout_p, &inout_p->child));
            break;
        case LY_STMT_LEAF:
            LY_CHECK_RET(parse_leaf(ctx, (struct lysp_node *)inout_p, &inout_p->child));
            break;
        case LY_STMT_LEAF_LIST:
            LY_CHECK_RET(parse_leaflist(ctx, (struct lysp_node *)inout_p, &inout_p->child));
            break;
        case LY_STMT_LIST:
            LY_CHECK_RET(parse_list(ctx, (struct lysp_node *)inout_p, &inout_p->child));
            break;
        case LY_STMT_USES:
            LY_CHECK_RET(parse_uses(ctx, (struct lysp_node *)inout_p, &inout_p->child));
            break;
        case LY_STMT_TYPEDEF:
            LY_CHECK_RET(parse_typedef(ctx, (struct lysp_node *)inout_p, &inout_p->typedefs));
            break;
        case LY_STMT_MUST:
            PARSER_CHECK_STMTVER2_RET(ctx, "must", lyplg_ext_stmt2str(inout_kw));
            LY_CHECK_RET(parse_restrs(ctx, kw, &inout_p->musts));
            break;
        case LY_STMT_GROUPING:
            LY_CHECK_RET(parse_grouping(ctx, (struct lysp_node *)inout_p, &inout_p->groupings));
            break;
        case LY_STMT_EXTENSION_INSTANCE:
            LY_CHECK_RET(parse_ext(ctx, word, word_len, inout_p, inout_kw, 0, &inout_p->exts));
            break;
        default:
            LOGVAL_PARSER(ctx, LY_VCODE_INCHILDSTMT, lyplg_ext_stmt2str(kw), lyplg_ext_stmt2str(inout_kw));
            return LY_EVALID;
        }
        YANG_READ_SUBSTMT_NEXT_ITER(ctx, kw, word, word_len, inout_p->exts, ret, cleanup);
    }

cleanup:
    return ret;
}